

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O2

void wostringstream_suite::test_single(void)

{
  bool v;
  undefined1 local_1a1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1a0;
  wostringstream output;
  int aiStack_160 [86];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&output);
  local_1a0._M_dataplus._M_p._0_1_ = *(int *)((long)aiStack_160 + *(long *)(_output + -0x18)) == 0;
  local_1a1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(1)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x6e,"void wostringstream_suite::test_single()",&local_1a0,&local_1a1);
  std::operator<<((wostream *)&output,L'A');
  std::__cxx11::wstringbuf::str();
  v = std::operator==(&local_1a0,L"A");
  boost::detail::test_impl
            ("output.str() == L\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x70,"void wostringstream_suite::test_single()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&output);
  return;
}

Assistant:

void test_single()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(1), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(L'A'));
    TRIAL_PROTOCOL_TEST(output.str() == L"A");
}